

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall
LLVMBC::StreamState::append<LLVMBC::BasicBlock*,char_const(&)[3],LLVMBC::BasicBlock*>
          (StreamState *this,BasicBlock **t,char (*ts) [3],BasicBlock **ts_1)

{
  append(this,*t,false);
  append<char_const(&)[3],LLVMBC::BasicBlock*>(this,ts,ts_1);
  return;
}

Assistant:

void append(T &&t, Ts &&... ts)
	{
		append(std::forward<T>(t));
		append(std::forward<Ts>(ts)...);
	}